

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareDstPxls
          (FunctionalTest *this,targetDesc *desc,GLubyte **out_pixels)

{
  GLenum GVar1;
  GLenum internal_format;
  GLuint GVar2;
  uint uVar3;
  GLubyte *pGVar4;
  GLuint i;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  GLuint depths [3];
  GLuint widths [3];
  GLuint heights [3];
  
  GVar1 = desc->m_target;
  internal_format = desc->m_internal_format;
  lVar6 = 1;
  if ((int)GVar1 < 0x9100) {
    if ((GVar1 == 0x84f5) || (GVar1 == 0x8d41)) goto LAB_0087a7b4;
  }
  else if ((GVar1 == 0x9100) || (GVar1 == 0x9102)) goto LAB_0087a7b4;
  lVar6 = 3;
LAB_0087a7b4:
  GVar2 = Utils::getPixelSizeForFormat(internal_format);
  GVar1 = desc->m_type;
  calculateDimmensions
            ((FunctionalTest *)heights,desc->m_target,desc->m_level,desc->m_width,desc->m_height,
             widths,heights,depths);
  lVar5 = 0;
  do {
    uVar7 = (ulong)(widths[lVar5] * GVar2 * heights[lVar5] * depths[lVar5]);
    pGVar4 = (GLubyte *)operator_new__(uVar7);
    out_pixels[lVar5] = pGVar4;
    memset(pGVar4,0,uVar7);
    lVar5 = lVar5 + 1;
  } while (lVar6 != lVar5);
  lVar5 = 0;
  do {
    uVar3 = widths[lVar5] * depths[lVar5] * heights[lVar5];
    if (uVar3 != 0) {
      pGVar4 = out_pixels[lVar5];
      uVar8 = (ulong)uVar3;
      uVar7 = 0;
      do {
        Utils::packPixel(internal_format,GVar1,1.0,1.0,1.0,1.0,pGVar4 + uVar7);
        uVar7 = (ulong)((int)uVar7 + GVar2);
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != lVar6);
  return;
}

Assistant:

void FunctionalTest::prepareDstPxls(const FunctionalTest::targetDesc& desc, GLubyte** out_pixels) const
{
	const GLenum internal_format = desc.m_internal_format;
	const bool   is_multi_level  = Utils::isTargetMultilevel(desc.m_target);
	GLuint		 n_levels		 = 1;
	const GLuint pixel_size		 = Utils::getPixelSizeForFormat(desc.m_internal_format);
	const GLenum type			 = desc.m_type;

	/* Configure levels */
	if (true == is_multi_level)
	{
		n_levels = FUNCTIONAL_TEST_N_LEVELS;
	}

	/* Calculate dimmensions */
	GLuint heights[FUNCTIONAL_TEST_N_LEVELS];
	GLuint widths[FUNCTIONAL_TEST_N_LEVELS];
	GLuint depths[FUNCTIONAL_TEST_N_LEVELS];

	calculateDimmensions(desc.m_target, desc.m_level, desc.m_width, desc.m_height, widths, heights, depths);

	/* Prepare storage */
	for (GLuint i = 0; i < n_levels; ++i)
	{
		const GLuint req_memory_per_layer = pixel_size * widths[i] * heights[i];
		const GLuint req_memory_for_level = req_memory_per_layer * depths[i];

		out_pixels[i] = new GLubyte[req_memory_for_level];

		if (0 == out_pixels[i])
		{
			TCU_FAIL("Memory allocation failed");
		}

		memset(out_pixels[i], 0, req_memory_for_level);
	}

	/* Fill pixels */
	for (GLuint i = 0; i < n_levels; ++i)
	{
		const GLuint n_layers = depths[i];
		const GLuint n_pixels = widths[i] * heights[i];
		GLubyte*	 ptr	  = (GLubyte*)out_pixels[i];

		for (GLuint j = 0; j < n_pixels * n_layers; ++j)
		{
			GLubyte* pixel_data = ptr + j * pixel_size;

			Utils::packPixel(internal_format, type, 1.0, 1.0, 1.0, 1.0, pixel_data);
		}
	}
}